

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRBMemoryAllocator.cpp
# Opt level: O1

void __thiscall Diligent::SRBMemoryAllocator::~SRBMemoryAllocator(SRBMemoryAllocator *this)

{
  uint uVar1;
  long lVar2;
  
  if (this->m_DataAllocators != (FixedBlockMemoryAllocator *)0x0) {
    uVar1 = this->m_ResourceCacheDataAllocatorCount + this->m_ShaderVariableDataAllocatorCount;
    if (uVar1 != 0) {
      lVar2 = 0;
      do {
        FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator
                  ((FixedBlockMemoryAllocator *)
                   ((long)&(this->m_DataAllocators->super_IMemoryAllocator)._vptr_IMemoryAllocator +
                   lVar2));
        lVar2 = lVar2 + 0x130;
      } while ((ulong)uVar1 * 0x130 - lVar2 != 0);
    }
    (*this->m_RawMemAllocator->_vptr_IMemoryAllocator[1])
              (this->m_RawMemAllocator,this->m_DataAllocators);
  }
  return;
}

Assistant:

SRBMemoryAllocator::~SRBMemoryAllocator()
{
    if (m_DataAllocators != nullptr)
    {
        auto TotalAllocatorCount = m_ShaderVariableDataAllocatorCount + m_ResourceCacheDataAllocatorCount;
        for (Uint32 s = 0; s < TotalAllocatorCount; ++s)
        {
            m_DataAllocators[s].~FixedBlockMemoryAllocator();
        }
        m_RawMemAllocator.Free(m_DataAllocators);
    }
}